

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_throw(CHAR_DATA *ch,char *argument)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  CHAR_DATA *ch_00;
  short sVar6;
  short sVar7;
  char *txt;
  long lVar8;
  AFFECT_DATA af;
  char arg [4608];
  
  iVar3 = get_skill(ch,(int)gsn_throw);
  if (iVar3 == 0) {
LAB_00296b3e:
    send_to_char("Throwing? What\'s that?\n\r",ch);
    return;
  }
  sVar7 = ch->level;
  lVar8 = (long)gsn_throw;
  this = ch->my_class;
  if ((this == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
    this = CClass::GetClass(0);
  }
  iVar4 = CClass::GetIndex(this);
  if (sVar7 < *(short *)(lVar8 * 0x60 + 0x44e788 + (long)iVar4 * 2)) goto LAB_00296b3e;
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    ch_00 = ch->fighting;
  }
  else {
    ch_00 = get_char_room(ch,arg);
  }
  if (ch_00 == (CHAR_DATA *)0x0) {
    txt = "They aren\'t here.\n\r";
LAB_00296c2c:
    send_to_char(txt,ch);
    return;
  }
  if (ch_00 == ch) {
    txt = "Now that would be a bit stupid.\n\r";
    goto LAB_00296c2c;
  }
  if ((ch_00->fighting != ch) && (ch->fighting != ch_00)) {
    txt = "But you aren\'t engaged in combat with them.\n\r";
    goto LAB_00296c2c;
  }
  bVar2 = is_affected(ch_00,(int)gsn_protective_shield);
  if (bVar2) {
    act("$N\'s throw seems to slide around you.",ch_00,(void *)0x0,ch,3);
    act("$N\'s throw seems to slide around $n.",ch_00,(void *)0x0,ch,1);
    act("Your throw seems to slide around $n.",ch_00,(void *)0x0,ch,2);
  }
  else {
    bVar2 = is_affected(ch_00,(int)gsn_sanguine_ward);
    if (bVar2) {
      act("$N tries to throw you but your sanguine ward keeps $M at bay.",ch_00,(void *)0x0,ch,3);
      act("$n\'s ward flares brightly as $N tries to throw $m, deflecting the attack!",ch_00,
          (void *)0x0,ch,1);
      act("$n\'s ward flares brightly as you try to throw $m, sending you flying back!",ch_00,
          (void *)0x0,ch,2);
      iVar3 = 0xc;
      goto LAB_00296ca2;
    }
    bVar2 = is_affected(ch_00,(int)gsn_heatshield);
    if (bVar2) {
      act("$N tries to throw you but is stopped by a wave of searing heat.",ch_00,(void *)0x0,ch,3);
      act("$N tries to throw $n but a wave of searing heat stops him.",ch_00,(void *)0x0,ch,1);
      act("You try to throw $n but a wave of searing heat stops you!",ch_00,(void *)0x0,ch,2);
      WAIT_STATE(ch,0xc);
      iVar3 = dice(8,10);
      damage_new(ch_00,ch,iVar3,(int)gsn_heatshield,4,true,true,0,1,(char *)0x0);
      return;
    }
    bVar2 = is_affected(ch_00,(int)gsn_elecshield);
    if (bVar2) {
      act("$N attempts to throw you, but collides with your electric shield.",ch_00,(void *)0x0,ch,3
         );
      act("$N attempts to throw $n, but collides with $s electric shield.",ch_00,(void *)0x0,ch,1);
      act("You are stopped by an electric field, shocking you and sapping your energy!",ch_00,
          (void *)0x0,ch,2);
      WAIT_STATE(ch,0xc);
      iVar3 = dice(2,10);
      damage_new(ch_00,ch,iVar3,(int)gsn_elecshield,6,true,true,0,1,(char *)0x0);
      iVar3 = ch->hit;
      iVar4 = dice(5,10);
      iVar3 = iVar3 - iVar4;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      ch->hit = iVar3;
      return;
    }
    bVar2 = is_affected(ch_00,(int)gsn_airshield);
    if (bVar2) {
      act("$N attempts to throw you, but a curtain of swirling winds throws $M back!",ch_00,
          (void *)0x0,ch,3);
      act("$N attempts to throw $n, but a curtain of swirling winds throws $M back!",ch_00,
          (void *)0x0,ch,1);
      act("You try to throw $n but a curtain of swirling winds throw you back!",ch_00,(void *)0x0,ch
          ,2);
      iVar3 = dice(2,10);
      damage_new(ch_00,ch,iVar3,(int)gsn_airshield,0xe,true,true,0,1,(char *)0x0);
    }
    else {
      bVar2 = is_affected(ch_00,(int)gsn_earthshield);
      if (bVar2) {
        act("$N attempts to throw you, but collides with your earthshield.",ch_00,(void *)0x0,ch,3);
        act("$N attempts to throw $n, but instead collides with a solid barrier.",ch_00,(void *)0x0,
            ch,1);
        act("Your hear your bones crack as you slam into a rock-hard shield around $n.",ch_00,
            (void *)0x0,ch,2);
        iVar3 = dice(2,10);
        damage_new(ch_00,ch,iVar3,(int)gsn_earthshield,1,true,true,0,1,(char *)0x0);
        init_affect(&af);
        af.where = 0;
        af.aftype = 3;
        af.type = gsn_shattered_bone;
        af.name = palloc_string("broken bones");
        af.level = ch->level;
        af.duration = af.level / 5;
        af.location = 1;
        af.modifier = -1;
        affect_to_char(ch,&af);
        af.location = 2;
        af.modifier = -1;
        affect_to_char(ch,&af);
      }
      else {
        bVar2 = is_affected(ch_00,(int)gsn_watershield);
        if (bVar2) {
          act("$N attempts to throw you, and you feel slightly invigorated as $E crashes into your watershield."
              ,ch_00,(void *)0x0,ch,3);
          act("$n looks slightly invigorated as $N crashes into $s watershield.",ch_00,(void *)0x0,
              ch,1);
          act("You feel drained as your mass collides with $n\'s shield of swirling water.",ch_00,
              (void *)0x0,ch,2);
          iVar3 = dice(3,10);
          damage_new(ch_00,ch,iVar3,(int)gsn_watershield,0xe,true,true,0,1,(char *)0x0);
          iVar3 = iVar3 + ch_00->hit;
          if (ch_00->max_hit <= iVar3) {
            iVar3 = (int)ch_00->max_hit;
          }
          ch_00->hit = iVar3;
          bVar2 = is_npc(ch);
          if (bVar2) {
            return;
          }
          sVar6 = (short)*(undefined4 *)(ch->pcdata->condition + 2) + 8;
          sVar7 = 0x32;
          if (sVar6 < 0x32) {
            sVar7 = sVar6;
          }
          ch->pcdata->condition[2] = sVar7;
          return;
        }
        bVar2 = is_affected(ch_00,(int)gsn_coldshield);
        if (!bVar2) {
          sVar7 = ch->level;
          sVar6 = ch_00->level;
          iVar4 = get_curr_stat(ch_00,3);
          iVar5 = get_curr_stat(ch,3);
          iVar3 = ((((iVar3 + sVar7) - (iVar4 + sVar6)) + iVar5 / 2) * 9) / 10;
          iVar4 = 0x5a;
          if (iVar3 < 0x5a) {
            iVar4 = iVar3;
          }
          iVar3 = 5;
          if (5 < iVar4) {
            iVar3 = iVar4;
          }
          iVar4 = number_percent();
          if (iVar3 < iVar4) {
            iVar4 = 0;
            check_improve(ch,(int)gsn_throw,false,3);
          }
          else {
            uVar1 = ch->level;
            iVar4 = 0x1e;
            if (((((((0x12 < (short)uVar1) && (iVar4 = 0x23, 0x16 < uVar1)) &&
                   (iVar4 = 0x28, 0x19 < uVar1)) &&
                  ((iVar4 = 0x2d, 0x1c < uVar1 && (iVar4 = 0x30, 0x20 < uVar1)))) &&
                 ((iVar4 = 0x34, 0x23 < uVar1 &&
                  ((iVar4 = 0x38, 0x26 < uVar1 && (iVar4 = 0x3c, 0x28 < uVar1)))))) &&
                (iVar4 = 0x40, 0x2b < uVar1)) && (iVar4 = 0x44, 0x2d < uVar1)) {
              iVar4 = (uint)(0x30 < uVar1) * 2 + 0x46;
            }
            act("$n grabs $N and throws $M to the ground with stunning force!",ch,(void *)0x0,ch_00,
                1);
            act("You grab $N and throw $M to the ground with stunning force!",ch,(void *)0x0,ch_00,3
               );
            act("$n grabs you and throws you to the ground with stunning force!",ch,(void *)0x0,
                ch_00,2);
            iVar5 = get_curr_stat(ch,0);
            iVar4 = str_app[iVar5].todam + iVar4;
            check_improve(ch,(int)gsn_throw,true,3);
            LAG_CHAR(ch_00,0x18);
          }
          damage_new(ch,ch_00,iVar4,(int)gsn_throw,1,true,true,0,1,(char *)0x0);
          WAIT_STATE(ch,0x18);
          if (ch->fighting != ch_00) {
            return;
          }
          check_ground_control(ch,ch_00,(float)iVar3,iVar4);
          return;
        }
        act("$N attempts to throw you, but is stopped by a wave of freezing air.",ch_00,(void *)0x0,
            ch,3);
        act("$N attempts to throw $n, but is stopped by a wave of freezing air.",ch_00,(void *)0x0,
            ch,1);
        act("You attempt to throw $n, but are seared by a wave of freezing air.",ch_00,(void *)0x0,
            ch,2);
        (*skill_table[(int)gsn_chill].spell_fun)((int)gsn_chill,(int)ch->level,ch_00,ch,1);
      }
    }
  }
  iVar3 = 0x18;
LAB_00296ca2:
  WAIT_STATE(ch,iVar3);
  return;
}

Assistant:

void do_throw(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;
	int dam, chance;
	char arg[MAX_INPUT_LENGTH];

	chance = get_skill(ch, gsn_throw);

	if (chance == 0
		|| ch->level < skill_table[gsn_throw].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Throwing? What's that?\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Now that would be a bit stupid.\n\r", ch);
		return;
	}

	if ((victim->fighting != ch) && (ch->fighting != victim))
	{
		send_to_char("But you aren't engaged in combat with them.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_protective_shield))
	{
		act("$N's throw seems to slide around you.", victim, 0, ch, TO_CHAR);
		act("$N's throw seems to slide around $n.", victim, 0, ch, TO_NOTVICT);
		act("Your throw seems to slide around $n.", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	if (is_affected(victim, gsn_sanguine_ward))
	{
		act("$N tries to throw you but your sanguine ward keeps $M at bay.", victim, 0, ch, TO_CHAR);
		act("$n's ward flares brightly as $N tries to throw $m, deflecting the attack!", victim, 0, ch, TO_NOTVICT);
		act("$n's ward flares brightly as you try to throw $m, sending you flying back!", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 1);
		return;
	}

	if (is_affected(victim, gsn_heatshield))
	{
		act("$N tries to throw you but is stopped by a wave of searing heat.", victim, 0, ch, TO_CHAR);
		act("$N tries to throw $n but a wave of searing heat stops him.", victim, 0, ch, TO_NOTVICT);
		act("You try to throw $n but a wave of searing heat stops you!", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 1);
		damage_old(victim, ch, dice(8, 10), gsn_heatshield, DAM_FIRE, true);
		return;
	}

	if (is_affected(victim, gsn_elecshield))
	{
		act("$N attempts to throw you, but collides with your electric shield.", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but collides with $s electric shield.", victim, 0, ch, TO_NOTVICT);
		act("You are stopped by an electric field, shocking you and sapping your energy!", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 1);

		damage_old(victim, ch, dice(2, 10), gsn_elecshield, DAM_LIGHTNING, true);
		ch->hit = std::max(ch->hit - dice(5, 10), 0);
		return;
	}

	if (is_affected(victim, gsn_airshield))
	{
		act("$N attempts to throw you, but a curtain of swirling winds throws $M back!", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but a curtain of swirling winds throws $M back!", victim, 0, ch, TO_NOTVICT);
		act("You try to throw $n but a curtain of swirling winds throw you back!", victim, 0, ch, TO_VICT);

		dam = dice(2, 10);
		damage_old(victim, ch, dam, gsn_airshield, DAM_DROWNING, true);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	if (is_affected(victim, gsn_earthshield))
	{
		act("$N attempts to throw you, but collides with your earthshield.", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but instead collides with a solid barrier.", victim, 0, ch, TO_NOTVICT);
		act("Your hear your bones crack as you slam into a rock-hard shield around $n.", victim, 0, ch, TO_VICT);
		damage_old(victim, ch, dice(2, 10), gsn_earthshield, DAM_BASH, true);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = gsn_shattered_bone;
		af.name = palloc_string("broken bones");
		af.level = ch->level;
		af.duration = ch->level / 5;
		af.location = APPLY_STR;
		af.modifier = -1;
		affect_to_char(ch, &af);

		af.location = APPLY_DEX;
		af.modifier = -1;
		affect_to_char(ch, &af);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	if (is_affected(victim, gsn_watershield))
	{
		act("$N attempts to throw you, and you feel slightly invigorated as $E crashes into your watershield.", victim, 0, ch, TO_CHAR);
		act("$n looks slightly invigorated as $N crashes into $s watershield.", victim, 0, ch, TO_NOTVICT);
		act("You feel drained as your mass collides with $n's shield of swirling water.", victim, 0, ch, TO_VICT);

		dam = dice(3, 10);
		damage_old(victim, ch, dam, gsn_watershield, DAM_DROWNING, true);
		victim->hit = std::min(victim->hit + dam, (int)victim->max_hit);

		if (!is_npc(ch))
		{
			ch->pcdata->condition[COND_THIRST] += 8;
			ch->pcdata->condition[COND_THIRST] = std::min((int)ch->pcdata->condition[COND_THIRST], COND_HUNGRY);
		}

		return;
	}

	if (is_affected(victim, gsn_coldshield))
	{
		act("$N attempts to throw you, but is stopped by a wave of freezing air.", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but is stopped by a wave of freezing air.", victim, 0, ch, TO_NOTVICT);
		act("You attempt to throw $n, but are seared by a wave of freezing air.", victim, 0, ch, TO_VICT);
		(*skill_table[gsn_chill].spell_fun)(gsn_chill, ch->level, victim, ch, TAR_CHAR_OFFENSIVE);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	chance += (ch->level - victim->level);
	chance -= get_curr_stat(victim, STAT_DEX);
	chance += get_curr_stat(ch, STAT_DEX) / 2;
	chance *= 9;
	chance /= 10;
	chance = URANGE(5, chance, 90);

	if (number_percent() > chance)
	{
		dam = 0;
		check_improve(ch, gsn_throw, false, 3);
	}
	else
	{
		if (ch->level <= 18)
			dam = 30;
		else if (ch->level <= 22)
			dam = 35;
		else if (ch->level <= 25)
			dam = 40;
		else if (ch->level <= 28)
			dam = 45;
		else if (ch->level <= 32)
			dam = 48;
		else if (ch->level <= 35)
			dam = 52;
		else if (ch->level <= 38)
			dam = 56;
		else if (ch->level <= 40)
			dam = 60;
		else if (ch->level <= 43)
			dam = 64;
		else if (ch->level <= 45)
			dam = 68;
		else if (ch->level <= 48)
			dam = 70;
		else
			dam = 72;

		act("$n grabs $N and throws $M to the ground with stunning force!", ch, 0, victim, TO_NOTVICT);
		act("You grab $N and throw $M to the ground with stunning force!", ch, 0, victim, TO_CHAR);
		act("$n grabs you and throws you to the ground with stunning force!", ch, 0, victim, TO_VICT);

		dam += str_app[get_curr_stat(ch, STAT_STR)].todam;
		check_improve(ch, gsn_throw, true, 3);
		LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
	}

	damage_old(ch, victim, dam, gsn_throw, DAM_BASH, true);
	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);

	if (ch->fighting == victim)
		check_ground_control(ch, victim, chance, dam);
}